

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this)

{
  char *pcVar1;
  LogMessage *other;
  int *piVar2;
  int local_74;
  EpsCopyInputStream *local_70;
  char *p;
  byte local_51;
  LogMessage local_50;
  EpsCopyInputStream *local_18;
  EpsCopyInputStream *this_local;
  
  local_51 = 0;
  local_18 = this;
  if (this->limit_ < 0x11) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
               ,0x9e);
    local_51 = 1;
    other = LogMessage::operator<<(&local_50,"CHECK failed: limit_ > kSlopBytes: ");
    LogFinisher::operator=((LogFinisher *)((long)&p + 3),other);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  local_70 = (EpsCopyInputStream *)NextBuffer(this,0,-1);
  if (local_70 == (EpsCopyInputStream *)0x0) {
    this->limit_end_ = this->buffer_end_;
    SetEndOfStream(this);
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    this->limit_ = this->limit_ - ((int)this->buffer_end_ - (int)local_70);
    pcVar1 = this->buffer_end_;
    local_74 = 0;
    piVar2 = std::min<int>(&local_74,&this->limit_);
    this->limit_end_ = pcVar1 + *piVar2;
    this_local = local_70;
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::Next() {
  GOOGLE_DCHECK(limit_ > kSlopBytes);
  auto p = NextBuffer(0 /* immaterial */, -1);
  if (p == nullptr) {
    limit_end_ = buffer_end_;
    // Distinguish ending on a pushed limit or ending on end-of-stream.
    SetEndOfStream();
    return nullptr;
  }
  limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return p;
}